

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O3

parser_error parse_player_timed_slay(parser *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  char *__s1;
  parser_error pVar5;
  ulong uVar6;
  slay_conflict *psVar7;
  
  plVar4 = (long *)parser_priv(p);
  __s1 = parser_getsym(p,"name");
  if (plVar4 == (long *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-timed.c"
                  ,0x187,"enum parser_error parse_player_timed_slay(struct parser *)");
  }
  lVar2 = *plVar4;
  if (lVar2 == 0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pVar5 = PARSE_ERROR_UNRECOGNISED_SLAY;
    if (__s1 != (char *)0x0) {
      bVar1 = z_info->slay_max;
      uVar6 = 1;
      if (bVar1 < 2) {
LAB_001aa4f0:
        if ((uint)uVar6 != (uint)bVar1) {
          *(uint *)(lVar2 + 0x70) = (uint)uVar6;
          pVar5 = PARSE_ERROR_NONE;
        }
      }
      else {
        uVar6 = 1;
        psVar7 = slays;
        do {
          psVar7 = psVar7 + 1;
          iVar3 = strcmp(__s1,psVar7->code);
          if (iVar3 == 0) goto LAB_001aa4f0;
          uVar6 = uVar6 + 1;
        } while (bVar1 != uVar6);
      }
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_player_timed_slay(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getsym(p, "name");
	int idx = z_info->slay_max;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (name) {
		for (idx = 1; idx < z_info->slay_max; ++idx) {
			if (streq(name, slays[idx].code)) break;
		}
	}
	if (idx == z_info->slay_max) {
		return PARSE_ERROR_UNRECOGNISED_SLAY;
	}
	ps->t->temp_slay = idx;
	return PARSE_ERROR_NONE;
}